

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcExtrudedAreaSolid::IfcExtrudedAreaSolid(IfcExtrudedAreaSolid *this)

{
  IfcExtrudedAreaSolid *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x70,"IfcExtrudedAreaSolid");
  IfcSweptAreaSolid::IfcSweptAreaSolid
            (&this->super_IfcSweptAreaSolid,&PTR_construction_vtable_24__00f5e4e0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcExtrudedAreaSolid,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcExtrudedAreaSolid,_2UL> *)
             &(this->super_IfcSweptAreaSolid).field_0x50,&PTR_construction_vtable_24__00f5e590);
  (this->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf5e400;
  *(undefined8 *)&this->field_0x70 = 0xf5e4c8;
  *(undefined8 *)
   &(this->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf5e428;
  *(undefined8 *)
   &(this->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf5e450;
  *(undefined8 *)
   &(this->super_IfcSweptAreaSolid).super_IfcSolidModel.super_IfcGeometricRepresentationItem.
    field_0x30 = 0xf5e478;
  *(undefined8 *)&(this->super_IfcSweptAreaSolid).field_0x50 = 0xf5e4a0;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcDirection> *)
             &(this->super_IfcSweptAreaSolid).field_0x60,(LazyObject *)0x0);
  return;
}

Assistant:

IfcExtrudedAreaSolid() : Object("IfcExtrudedAreaSolid") {}